

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall ON_ClippingPlaneInfo::Write(ON_ClippingPlaneInfo *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,3);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WritePlaneEquation(file,&this->m_plane_equation);
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_plane_id), bVar1)) &&
        (bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bEnabled), bVar1)) &&
       (bVar1 = ON_BinaryArchive::WriteDouble(file,(double)this->m_depth), bVar1)) {
      bVar1 = ON_BinaryArchive::WriteBool(file,this->m_depth_enabled);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_ClippingPlaneInfo::Write( ON_BinaryArchive& file ) const
{
  // version 1.1 and 1.2 - write distance as a double
  // In version 1.1 we wrote -1 as the default value for m_distance.
  // This default has changed to ON_UNSET_POSITIVE_FLOAT. Bumping the minor
  // version so we can properly handle the default case when reading.
  //
  // 28 Mar 2023 S. Baer (RH-73816)
  // We went back to using a negative value to define "unset". We don't need
  // to adjust the minor version number for this
  // 6 April 2023 S. Baer (RH-74002)
  // version 1.3
  // Added a bool toggle to state if depth is being used. This frees up the depth
  // numeric value to be any number and not have reserved "unset" numbers
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,3);
  if (!rc)
    return false;
  
  for(;;)
  {
    rc = file.WritePlaneEquation(m_plane_equation);
    if (!rc) break;

    rc = file.WriteUuid(m_plane_id);
    if (!rc) break;

    rc = file.WriteBool(m_bEnabled);
    if (!rc) break;

    rc = file.WriteDouble(m_depth);
    if (!rc) break;

    // version 1.3, add depth enabled bool
    rc = file.WriteBool(m_depth_enabled);
    if (!rc) break;

    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}